

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall transaction_tests::tx_no_inputs::test_method(tx_no_inputs *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  CMutableTransaction empty;
  TxValidationState state;
  CTransaction *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  size_t in_stack_fffffffffffffdb8;
  size_t line_num;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  CTransaction *in_stack_fffffffffffffdc8;
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [2];
  const_string local_190;
  lazy_ostream local_180;
  TxValidationState *in_stack_ffffffffffffff10;
  CTransaction *in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffd88);
  TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffffd88);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
               (pointer)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (unsigned_long)in_stack_fffffffffffffd88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    CTransaction::CTransaction
              (in_stack_fffffffffffffdc8,
               (CMutableTransaction *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0))
    ;
    CheckTransaction(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
    in_stack_fffffffffffffdc8 = (CTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (char (*) [46])in_stack_fffffffffffffd88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
               (pointer)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (unsigned_long)in_stack_fffffffffffffd88);
    in_stack_fffffffffffffd88 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffea0,&local_180,&local_190,0x17b,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>
                        *)in_stack_fffffffffffffd88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd88);
    CTransaction::~CTransaction(in_stack_fffffffffffffd88);
    in_stack_fffffffffffffdc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffdc7);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
               (pointer)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (unsigned_long)in_stack_fffffffffffffd88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               line_num,(const_string *)
                        CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<TxValidationResult> *)
               CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    in_stack_fffffffffffffdb7 =
         std::operator==(in_stack_fffffffffffffd98,
                         (char *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
               (pointer)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (unsigned_long)in_stack_fffffffffffffd88);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd98,
               (pointer)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
               (unsigned_long)in_stack_fffffffffffffd88);
    in_stack_fffffffffffffd88 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c8,local_1e8,local_208,0x17c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffd88);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffffd88);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffd88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_no_inputs)
{
    CMutableTransaction empty;

    TxValidationState state;
    BOOST_CHECK_MESSAGE(!CheckTransaction(CTransaction(empty), state), "Transaction with no inputs should be invalid.");
    BOOST_CHECK(state.GetRejectReason() == "bad-txns-vin-empty");
}